

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlClosure.h
# Opt level: O1

ValVecT * __thiscall
dg::StrongControlClosure::getClosure
          (ValVecT *__return_storage_ptr__,StrongControlClosure *this,CDGraph *G,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *nodes)

{
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> X;
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  local_50;
  
  std::
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  ::_Rb_tree(&local_50,&nodes->_M_t);
  closeSet(this,G,(set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                  &local_50);
  (__return_storage_ptr__->super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dg::CDNode*,std::allocator<dg::CDNode*>>::
  _M_range_initialize<std::_Rb_tree_const_iterator<dg::CDNode*>>
            ((vector<dg::CDNode*,std::allocator<dg::CDNode*>> *)__return_storage_ptr__,
             local_50._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_50._M_impl.super__Rb_tree_header);
  std::
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  ::_M_erase(&local_50,(_Link_type)local_50._M_impl.super__Rb_tree_header._M_header._M_parent);
  return __return_storage_ptr__;
}

Assistant:

ValVecT getClosure(CDGraph &G, const std::set<CDNode *> &nodes) {
        auto X = nodes;
        closeSet(G, X);
        return {X.begin(), X.end()};
    }